

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::SelectCoinsSRD
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount target_value,CAmount change_fee,FastRandomContext *rng,int max_selection_weight)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  pointer pOVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Base_ptr p_Var8;
  size_t sVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong *puVar13;
  value_type *__x;
  size_t *psVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> indexes;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  heap;
  undefined1 local_198 [16];
  pointer local_188;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_138 [8];
  _Rb_tree_node_base local_130;
  size_t local_110;
  CAmount local_108;
  undefined8 uStack_100;
  _Storage<long,_true> local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  size_t sStack_e0;
  undefined8 local_d8;
  CAmount CStack_d0;
  priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
  local_c8;
  SelectionResult local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_algo = SRD;
  local_a8.m_use_effective = false;
  local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_a8.m_algo_completed = true;
  local_a8.m_weight = 0;
  local_a8.bump_fee_group_discount = 0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188 = (pointer)0x0;
  local_198 = (undefined1  [16])0x0;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.m_target = target_value;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198,
             ((long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
  auVar6 = _DAT_007d3440;
  if (local_198._0_8_ != local_198._8_8_) {
    uVar10 = local_198._8_8_ + (-8 - local_198._0_8_);
    auVar20._8_4_ = (int)uVar10;
    auVar20._0_8_ = uVar10;
    auVar20._12_4_ = (int)(uVar10 >> 0x20);
    auVar18._0_8_ = uVar10 >> 3;
    auVar18._8_8_ = auVar20._8_8_ >> 3;
    uVar12 = 0;
    auVar18 = auVar18 ^ _DAT_007d3440;
    auVar19 = _DAT_007d3430;
    do {
      auVar20 = auVar19 ^ auVar6;
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        *(ulong *)(local_198._0_8_ + uVar12 * 8) = uVar12;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        *(ulong *)(local_198._0_8_ + (uVar12 + 1) * 8) = uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar17 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar17 + 2;
    } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar12);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,FastRandomContext&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_198._0_8_,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_198._8_8_,rng);
  uVar11 = local_198._8_8_;
  if (local_198._0_8_ != local_198._8_8_) {
    p_Var1 = (_Base_ptr)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    psVar14 = (size_t *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28);
    lVar17 = 0;
    bVar16 = false;
    iVar15 = 0;
    puVar13 = (ulong *)local_198._0_8_;
LAB_00557cd0:
    uVar10 = *puVar13;
    pOVar4 = (utxo_pool->
             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = ((long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 3) *
             0x4ec4ec4ec4ec4ec5;
    if (uVar10 <= uVar12 && uVar12 - uVar10 != 0) {
      __x = pOVar4 + uVar10;
      std::
      priority_queue<wallet::OutputGroup,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>,_wallet::MinOutputGroupComparator>
      ::push(&local_c8,__x);
      lVar17 = lVar17 + *(long *)((long)&__x->m_value +
                                 (ulong)((__x->m_subtract_fee_outputs ^ 1) << 5));
      iVar15 = iVar15 + __x->m_weight;
      do {
        if (iVar15 <= max_selection_weight) break;
        lVar5 = *(long *)((long)&(local_c8.c.
                                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_value +
                         (ulong)(((local_c8.c.
                                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  m_subtract_fee_outputs ^ 1) << 5));
        iVar3 = (local_c8.c.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_weight;
        std::
        pop_heap<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::MinOutputGroupComparator>
                  (local_c8.c.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_c8.c.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_c8.c.
             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        std::
        vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~vector(&(local_c8.c.
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->m_outputs);
        iVar15 = iVar15 - iVar3;
        lVar17 = lVar17 - lVar5;
        bVar16 = true;
      } while (local_c8.c.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_start !=
               local_c8.c.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_finish);
      if (lVar17 < target_value + change_fee + 50000) goto code_r0x00557d9e;
      if (local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pOVar4 = local_c8.c.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&local_a8,
                     &(local_c8.c.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_outputs);
          local_a8.m_use_effective = (bool)(pOVar4->m_subtract_fee_outputs ^ 1);
          local_a8.m_weight = local_a8.m_weight + pOVar4->m_weight;
          std::
          pop_heap<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::MinOutputGroupComparator>
                    (local_c8.c.
                     super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_c8.c.
                     super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          local_c8.c.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_c8.c.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_finish + -1;
          std::
          vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~vector(&(local_c8.c.
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->m_outputs);
        } while (local_c8.c.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 local_c8.c.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      sVar9 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      p_Var8 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
        local_110 = 0;
        local_130._M_color = _S_red;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             p_Var1;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             p_Var1;
      }
      else {
        (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
        _M_parent = &local_130;
        local_110 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_130._M_color =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
             p_Var8;
        p_Var2 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        p_Var8->_M_parent = p_Var1;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
             sVar9;
        psVar14 = &local_110;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var2->_M_header;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var2->_M_header;
      }
      local_d8 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
      local_e8 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
      uStack_f0 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._9_7_,
                           local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_engaged);
      uStack_100 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
      CStack_d0 = local_a8.bump_fee_group_discount;
      sStack_e0 = local_a8.m_selections_evaluated;
      local_f8 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long>._M_payload;
      local_108 = local_a8.m_target;
      local_130._M_parent = (_Base_ptr)0x0;
      *psVar14 = 0;
      *(_Rb_tree_color *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_130._M_color;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
           local_d8;
      *(CAmount *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
           CStack_d0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
           local_e8;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
           sStack_e0;
      *(_Storage<long,_true> *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
           local_f8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
           uStack_f0;
      *(CAmount *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
           local_108;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
           uStack_100;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01'
      ;
      local_130._M_left = &local_130;
      local_130._M_right = &local_130;
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree(local_138);
      goto LAB_00558031;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar11 = std::__throw_out_of_range_fmt
                         (
                         "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         );
      if ((pointer)local_198._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
      }
      std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_c8.c);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_a8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar11);
      }
    }
    goto LAB_00558120;
  }
LAB_00557dc5:
  local_178 = local_168;
  *(undefined1 **)
   &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_wallet::SelectionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
       (undefined1 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
  local_170 = 0;
  local_168._1_15_ = SUB1615((undefined1  [16])0x0,1);
  auVar6[0xf] = 0;
  auVar6._0_15_ = local_168._1_15_;
  local_168 = auVar6 << 8;
  *(undefined1 **)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
       (undefined1 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
  local_158._8_8_ = 0;
  local_158._0_8_ = local_148;
  local_148._1_15_ = SUB1615((undefined1  [16])0x0,1);
  auVar7[0xf] = 0;
  auVar7._0_15_ = local_148._1_15_;
  local_148 = auVar7 << 8;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_variant).
           super__Variant_base<bilingual_str,_wallet::SelectionResult>.
           super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0';
LAB_00558031:
  if ((pointer)local_198._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
  }
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&local_c8.c);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00558120:
  __stack_chk_fail();
code_r0x00557d9e:
  puVar13 = puVar13 + 1;
  if (puVar13 == (ulong *)uVar11) goto code_r0x00557dad;
  goto LAB_00557cd0;
code_r0x00557dad:
  if (bVar16) {
    ErrorMaxWeightExceeded();
    goto LAB_00558031;
  }
  goto LAB_00557dc5;
}

Assistant:

util::Result<SelectionResult> SelectCoinsSRD(const std::vector<OutputGroup>& utxo_pool, CAmount target_value, CAmount change_fee, FastRandomContext& rng,
                                             int max_selection_weight)
{
    SelectionResult result(target_value, SelectionAlgorithm::SRD);
    std::priority_queue<OutputGroup, std::vector<OutputGroup>, MinOutputGroupComparator> heap;

    // Include change for SRD as we want to avoid making really small change if the selection just
    // barely meets the target. Just use the lower bound change target instead of the randomly
    // generated one, since SRD will result in a random change amount anyway; avoid making the
    // target needlessly large.
    target_value += CHANGE_LOWER + change_fee;

    std::vector<size_t> indexes;
    indexes.resize(utxo_pool.size());
    std::iota(indexes.begin(), indexes.end(), 0);
    std::shuffle(indexes.begin(), indexes.end(), rng);

    CAmount selected_eff_value = 0;
    int weight = 0;
    bool max_tx_weight_exceeded = false;
    for (const size_t i : indexes) {
        const OutputGroup& group = utxo_pool.at(i);
        Assume(group.GetSelectionAmount() > 0);

        // Add group to selection
        heap.push(group);
        selected_eff_value += group.GetSelectionAmount();
        weight += group.m_weight;

        // If the selection weight exceeds the maximum allowed size, remove the least valuable inputs until we
        // are below max weight.
        if (weight > max_selection_weight) {
            max_tx_weight_exceeded = true; // mark it in case we don't find any useful result.
            do {
                const OutputGroup& to_remove_group = heap.top();
                selected_eff_value -= to_remove_group.GetSelectionAmount();
                weight -= to_remove_group.m_weight;
                heap.pop();
            } while (!heap.empty() && weight > max_selection_weight);
        }

        // Now check if we are above the target
        if (selected_eff_value >= target_value) {
            // Result found, add it.
            while (!heap.empty()) {
                result.AddInput(heap.top());
                heap.pop();
            }
            return result;
        }
    }
    return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
}